

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_perform_authentication(connectdata *conn)

{
  CURLcode CVar1;
  smtpstate state2;
  smtpstate state1;
  char *initresp;
  size_t len;
  char *mech;
  smtpstate local_30;
  smtpstate local_2c;
  char *local_28;
  size_t local_20;
  char *local_18;
  
  CVar1 = CURLE_OK;
  local_18 = (char *)0x0;
  local_28 = (char *)0x0;
  local_20 = 0;
  local_2c = SMTP_STOP;
  local_30 = SMTP_STOP;
  if (((conn->bits).user_passwd == true) && ((conn->proto).imapc.resptag[2] != '\0')) {
    CVar1 = smtp_calc_sasl_details(conn,&local_18,&local_28,&local_20,&local_2c,&local_30);
    if (CVar1 == CURLE_OK) {
      if (local_18 == (char *)0x0) {
        Curl_infof(conn->data,"No known authentication mechanisms supported!\n");
        CVar1 = CURLE_LOGIN_DENIED;
      }
      else {
        CVar1 = smtp_perform_auth(conn,local_18,local_28,local_20,local_2c,local_30);
        if (local_28 != (char *)0x0) {
          (*Curl_cfree)(local_28);
        }
      }
    }
  }
  else {
    (conn->proto).imapc.state = IMAP_STOP;
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *mech = NULL;
  char *initresp = NULL;
  size_t len = 0;
  smtpstate state1 = SMTP_STOP;
  smtpstate state2 = SMTP_STOP;

  /* Check we have a username and password to authenticate with, and the
     server supports authentiation, and end the connect phase if not */
  if(!conn->bits.user_passwd || !smtpc->auth_supported) {
    state(conn, SMTP_STOP);

    return result;
  }

  /* Calculate the SASL login details */
  result = smtp_calc_sasl_details(conn, &mech, &initresp, &len, &state1,
                                  &state2);

  if(!result) {
    if(mech) {
      /* Perform SASL based authentication */
      result = smtp_perform_auth(conn, mech, initresp, len, state1, state2);

      Curl_safefree(initresp);
    }
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}